

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::visitUnary
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermUnary *node)

{
  pointer *pppTVar1;
  TSpirvInstruction *this_00;
  bool bVar2;
  uint uVar3;
  TPrecisionQualifier TVar4;
  SpvBuildLogger *this_01;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  Id IVar9;
  TLayoutPacking TVar10;
  Id IVar11;
  Id IVar12;
  CoherentFlags CVar13;
  Decoration decoration;
  uint uVar14;
  TBasicType TVar15;
  TOperator TVar16;
  Decoration DVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TGlslangToSpvTraverser *pTVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long *plVar20;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long *plVar21;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  uint uVar23;
  bool forwardReferenceOnly;
  uint uVar24;
  char *filename;
  TOperator op;
  uint uVar25;
  Op OVar26;
  undefined4 in_register_00000034;
  TIntermUnary *pTVar27;
  TType *pTVar28;
  TGlslangToSpvTraverser *this_02;
  uint uVar29;
  anon_class_1_0_00000001 *this_03;
  uint uVar30;
  TBasicType in_R9D;
  uint uVar31;
  uint uVar33;
  Builder *pBVar34;
  TPrecisionQualifier TVar35;
  bool bVar36;
  bool bVar37;
  Id local_104;
  TIntermUnary *node_local;
  Builder *local_f8;
  uint local_f0;
  Id invertedType;
  ulong local_e8;
  CoherentFlags lvalueCoherentFlags;
  OpDecorations decorations;
  anon_class_24_3_db054092 resultType;
  TVector<const_glslang::TIntermConstantUnion_*> constants;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  CoherentFlags local_58 [2];
  TIntermConstantUnion *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  ulong uVar32;
  
  pBVar34 = &this->builder;
  node_local = node;
  iVar7 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)
                    (node,CONCAT44(in_register_00000034,param_1));
  iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0xc);
  iVar8 = (**(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode)
                    (node);
  if (*(long *)CONCAT44(extraout_var_00,iVar8) == 0) {
    filename = (char *)0x0;
  }
  else {
    filename = *(char **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 8);
  }
  spv::Builder::setDebugSourceLocation(pBVar34,iVar7,filename);
  bVar2 = (this->builder).generatingOpCodeForSpecConst;
  iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1e])(node);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x58))
                     ((long *)CONCAT44(extraout_var_01,iVar7));
  if ((*(byte *)(lVar18 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  pTVar27 = node;
  IVar9 = createImageTextureFunctionCall(this,&node->super_TIntermOperator);
  if (IVar9 == 0) {
    TVar16 = (node->super_TIntermOperator).op;
    if (TVar16 == EOpDeclare) {
      spv::Builder::clearAccessChain(pBVar34);
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x31])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x10))
                ((long *)CONCAT44(extraout_var_06,iVar7),this);
      spv::Builder::clearAccessChain(pBVar34);
    }
    else {
      if (TVar16 == EOpArrayLength) {
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0xf0))
                           ((long *)CONCAT44(extraout_var_02,iVar7));
        uVar3 = *(uint *)(lVar18 + 8);
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        pTVar19 = (TGlslangToSpvTraverser *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0xf0))
                            ((long *)CONCAT44(extraout_var_03,iVar7));
        if ((uVar3 & 0x600000) == 0) {
          uVar3._0_1_ = (pTVar19->super_TIntermTraverser).preVisit;
          uVar3._1_1_ = (pTVar19->super_TIntermTraverser).inVisit;
          uVar3._2_1_ = (pTVar19->super_TIntermTraverser).postVisit;
          uVar3._3_1_ = (pTVar19->super_TIntermTraverser).rightToLeft;
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])(node);
          lVar18 = *(long *)CONCAT44(extraout_var_10,iVar7);
          if ((uVar3 >> 0x1b & 1) == 0) {
            plVar20 = (long *)(**(code **)(lVar18 + 0x40))();
            plVar20 = (long *)(**(code **)(*plVar20 + 400))(plVar20);
            (**(code **)(*plVar20 + 0x10))(plVar20,this);
            iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])(node);
            plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar7) + 0x40))
                                        ((long *)CONCAT44(extraout_var_11,iVar7));
            plVar20 = (long *)(**(code **)(*plVar20 + 0x198))(plVar20);
            lVar18 = (**(code **)(*plVar20 + 0x28))(plVar20);
            uVar3 = **(uint **)(*(long *)(lVar18 + 0xc0) + 8);
            IVar9 = spv::Builder::accessChainGetLValue(pBVar34);
            IVar9 = spv::Builder::createArrayLength(pBVar34,IVar9,uVar3);
          }
          else {
            pTVar19 = (TGlslangToSpvTraverser *)
                      (**(code **)(lVar18 + 0xf0))((long *)CONCAT44(extraout_var_10,iVar7));
            TVar10 = getExplicitLayout(pTVar19,(TType *)pTVar27);
            iVar7 = (*(pTVar19->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar19);
            IVar9 = convertGlslangToSpvType
                              (this,(TType *)pTVar19,TVar10,
                               (TQualifier *)CONCAT44(extraout_var_12,iVar7),false,false);
            IVar9 = spv::Builder::getCooperativeVectorNumComponents(pBVar34,IVar9);
          }
        }
        else {
          TVar10 = getExplicitLayout(pTVar19,(TType *)pTVar27);
          iVar7 = (*(pTVar19->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar19);
          IVar9 = convertGlslangToSpvType
                            (this,(TType *)pTVar19,TVar10,
                             (TQualifier *)CONCAT44(extraout_var_04,iVar7),false,false);
          OVar26 = (this->builder).module.idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[IVar9]->opCode;
          if ((OVar26 != OpTypeCooperativeMatrixKHR) && (OVar26 != OpTypeCooperativeMatrixNV)) {
            __assert_fail("builder.isCooperativeMatrixType(typeId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0xa30,
                          "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                         );
          }
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])(node);
          lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0xf0))
                             ((long *)CONCAT44(extraout_var_05,iVar7));
          if ((*(byte *)(lVar18 + 10) & 0x40) == 0) {
            (this->builder).generatingOpCodeForSpecConst = true;
            IVar9 = spv::Builder::createCooperativeMatrixLengthNV(pBVar34,IVar9);
          }
          else {
            IVar9 = spv::Builder::createCooperativeMatrixLengthKHR(pBVar34,IVar9);
          }
        }
        if (this->glslangIntermediate->source == EShSourceGlsl) {
          bVar5 = (this->builder).generatingOpCodeForSpecConst;
          IVar11 = spv::Builder::makeIntegerType(pBVar34,0x20,true);
          if (bVar5 == true) {
            IVar12 = spv::Builder::makeIntegerType(pBVar34,0x20,true);
            IVar12 = spv::Builder::makeIntConstant(pBVar34,IVar12,0,false);
            IVar9 = spv::Builder::createBinOp(pBVar34,OpIAdd,IVar11,IVar9,IVar12);
          }
          else {
            IVar9 = spv::Builder::createUnaryOp(pBVar34,OpBitcast,IVar11,IVar9);
          }
        }
        goto LAB_003ae61b;
      }
      resultType.invertedType = &invertedType;
      invertedType = 0;
      resultType.node = &node_local;
      IVar9 = invertedType;
      resultType.this = this;
      if (TVar16 == EOpInterpolateAtCentroid) {
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])(node);
        plVar20 = (long *)CONCAT44(extraout_var_07,iVar7);
        lVar18 = (**(code **)(*plVar20 + 0x80))(plVar20);
        IVar9 = 0;
        if ((lVar18 != 0) &&
           (lVar18 = (**(code **)(*plVar20 + 0x80))(plVar20), *(int *)(lVar18 + 0xb8) == 0x36)) {
          plVar20 = (long *)(**(code **)(*plVar20 + 0xa0))(plVar20);
          plVar20 = (long *)(**(code **)(*plVar20 + 400))(plVar20);
          pTVar19 = (TGlslangToSpvTraverser *)(**(code **)(*plVar20 + 0xf0))(plVar20);
          TVar10 = getExplicitLayout(pTVar19,(TType *)pTVar27);
          iVar7 = (*(pTVar19->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar19);
          in_R9D = EbtVoid;
          IVar9 = convertGlslangToSpvType
                            (this,(TType *)pTVar19,TVar10,
                             (TQualifier *)CONCAT44(extraout_var_08,iVar7),false,false);
        }
      }
      invertedType = IVar9;
      spv::Builder::clearAccessChain(pBVar34);
      IVar9 = invertedType;
      iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      plVar20 = (long *)CONCAT44(extraout_var_09,iVar7);
      if (IVar9 != 0) {
        plVar20 = (long *)(**(code **)(*plVar20 + 0x40))(plVar20);
        plVar20 = (long *)(**(code **)(*plVar20 + 400))(plVar20);
      }
      pTVar19 = this;
      (**(code **)(*plVar20 + 0x10))(plVar20);
      op = (TOperator)pTVar19;
      lvalueCoherentFlags._0_2_ = 0;
      TVar16 = (node_local->super_TIntermOperator).op;
      this_03 = (anon_class_1_0_00000001 *)(ulong)TVar16;
      local_f8 = pBVar34;
      if ((int)TVar16 < 0x262) {
        if (TVar16 - EOpAtomicCounterIncrement < 3) goto LAB_003aea6f;
        if (TVar16 == EOpSpirvInst) {
          plVar21 = (long *)(**(code **)(*plVar20 + 0x18))(plVar20);
          lVar18 = (**(code **)(*plVar21 + 0x108))(plVar21);
          if ((*(byte *)(lVar18 + 0xf) & 8) == 0) {
            this_03 = (anon_class_1_0_00000001 *)(ulong)(node_local->super_TIntermOperator).op;
            goto LAB_003aea62;
          }
          goto LAB_003aea6f;
        }
        if ((TVar16 == EOpInterpolateAtCentroid) &&
           (this_03 = (anon_class_1_0_00000001 *)0xa2,
           this->glslangIntermediate->source != EShSourceHlsl)) goto LAB_003aea6f;
LAB_003aea62:
        bVar5 = visitUnary::anon_class_1_0_00000001::operator()(this_03,op);
        if (bVar5) goto LAB_003aea6f;
        plVar21 = (long *)(**(code **)(*plVar20 + 0x18))(plVar20);
        lVar18 = (**(code **)(*plVar21 + 0x108))(plVar21);
        local_104 = 0;
        if ((*(byte *)(lVar18 + 0xf) & 0x10) == 0) {
          iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          pTVar28 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar7) + 0xf0))
                                       ((long *)CONCAT44(extraout_var_23,iVar7));
          local_104 = accessChainLoad(this,pTVar28);
        }
      }
      else {
        if ((0x13 < TVar16 - EOpRayQueryTerminate) ||
           ((0xc806dU >> (TVar16 - EOpRayQueryTerminate & 0x1f) & 1) == 0)) goto LAB_003aea62;
LAB_003aea6f:
        local_104 = spv::Builder::accessChainGetLValue(pBVar34);
        constants.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator._0_4_ = (this->builder).accessChain.base;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &constants.
                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    .
                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    ._M_impl.super__Vector_impl_data,&(this->builder).accessChain.indexChain);
        pTVar28 = (TType *)&(this->builder).accessChain.swizzle;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_80,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)pTVar28);
        local_68._0_4_ = (this->builder).accessChain.component;
        local_68._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
        uStack_60._0_1_ = (this->builder).accessChain.isRValue;
        uStack_60._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
        uStack_60._4_4_ = (this->builder).accessChain.alignment;
        lvalueCoherentFlags._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
        local_58[0]._0_2_ = lvalueCoherentFlags._0_2_;
        if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          pTVar28 = (TType *)((long)local_80.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_80.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,(ulong)pTVar28);
        }
        if (constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pTVar28 = (TType *)((long)constants.
                                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    .
                                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)constants.
                                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   .
                                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(constants.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)pTVar28);
        }
        plVar21 = (long *)(**(code **)(*plVar20 + 0x18))(plVar20);
        pTVar19 = (TGlslangToSpvTraverser *)(**(code **)(*plVar21 + 0xf0))(plVar21);
        CVar13 = TranslateCoherent(pTVar19,pTVar28);
        constants.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator._0_2_ = CVar13._0_2_;
        spv::Builder::AccessChain::CoherentFlags::operator|=
                  (&lvalueCoherentFlags,(CoherentFlags *)&constants);
      }
      TVar4 = (node_local->super_TIntermOperator).operationPrecision;
      TVar35 = *(uint *)&(node_local->super_TIntermOperator).super_TIntermTyped.type.qualifier.
                         field_0x8 >> 0x19 & 7;
      if (TVar4 != EpqNone) {
        TVar35 = TVar4;
      }
      local_f0 = 0;
      DVar17 = DecorationMax;
      if (TVar35 - EpqLow < 2) {
        DVar17 = DecorationRelaxedPrecision;
      }
      iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar7) + 0x58))
                         ((long *)CONCAT44(extraout_var_13,iVar7));
      decorations.noContraction = DecorationNoContraction;
      if ((*(ulong *)(lVar18 + 8) >> 0x24 & 1) == 0) {
        decorations.noContraction = DecorationMax;
      }
      iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0x58))
                         ((long *)CONCAT44(extraout_var_14,iVar7));
      pTVar19 = *(TGlslangToSpvTraverser **)(lVar18 + 8);
      decoration = TranslateNonUniformDecoration(this,(TQualifier *)pTVar19);
      TVar16 = (node_local->super_TIntermOperator).op;
      this_02 = pTVar19;
      IVar9 = invertedType;
      decorations.precision = DVar17;
      decorations.nonUniform = decoration;
      if (invertedType == 0) {
        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        this_02 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_15,iVar7);
        TVar10 = getExplicitLayout(this_02,(TType *)pTVar19);
        iVar7 = (*(this_02->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this_02);
        in_R9D = EbtVoid;
        IVar9 = convertGlslangToSpvType
                          (this,(TType *)this_02,TVar10,
                           (TQualifier *)CONCAT44(extraout_var_16,iVar7),false,false);
      }
      iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x1e])();
      iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar7) + 0x38))
                        ((long *)CONCAT44(extraout_var_17,iVar7));
      iVar8 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x31])();
      iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar8) + 0x100))
                        ((long *)CONCAT44(extraout_var_18,iVar8));
      pTVar19 = (TGlslangToSpvTraverser *)(ulong)IVar9;
      if ((this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[(long)pTVar19]->opCode == OpTypeVector) {
        this_02 = pTVar19;
        local_f0 = spv::Builder::getNumTypeConstituents(local_f8,IVar9);
      }
      uVar3 = local_f0;
      pBVar34 = local_f8;
      IVar11 = local_104;
      switch(TVar16) {
      case EOpConvNumeric:
        uVar33 = iVar8 - 4;
        uVar31 = iVar7 - 1;
        uVar32 = (ulong)uVar31;
        uVar14 = 0x6f;
        if ((uVar33 & 0xfffffff9) != 0) {
          uVar14 = 0;
        }
        if (2 < uVar31) {
          uVar14 = 0;
        }
        uVar29 = iVar8 - 5;
        uVar25 = 0x70;
        if ((uVar29 & 0xfffffff9) != 0) {
          uVar25 = uVar14;
        }
        if (2 < uVar31) {
          uVar25 = uVar14;
        }
        uVar23 = iVar8 - 1;
        uVar14 = iVar7 - 4;
        if (uVar23 < 3) {
          if ((uVar14 & 0xfffffff9) == 0) {
            uVar25 = 0x6e;
          }
          if ((iVar7 - 5U & 0xfffffff9) == 0) {
            uVar25 = 0x6d;
          }
        }
        uVar24 = iVar7 - 5;
        uVar30 = 0x72;
        if (((uVar33 | uVar14) & 0xfffffff9) != 0) {
          uVar30 = uVar25;
        }
        this_02 = (TGlslangToSpvTraverser *)0x71;
        if (((uVar24 | uVar29) & 0xfffffff9) != 0) {
          this_02 = (TGlslangToSpvTraverser *)(ulong)uVar30;
        }
        if (((2 < uVar31) || (2 < uVar23)) ||
           (this_02 = (TGlslangToSpvTraverser *)0x73,
           (this->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[(long)pTVar19]->opCode != OpTypeMatrix)) {
          bVar5 = (uVar29 & 0xfffffff9) != 0;
          bVar36 = (uVar33 & 0xfffffff9) != 0;
          if (!bVar36 || !bVar5) {
            bVar37 = (uVar24 & 0xfffffff9) == 0;
            local_e8 = uVar32;
            if (((uVar14 & 0xfffffff9) == 0 || bVar37) && (((uVar29 & 0xfffffff9) == 0) != bVar37))
            {
              if ((10 < uVar23) || (10 < uVar31)) goto switchD_003aefb7_default;
              if (*(int *)(&DAT_006fe458 + (ulong)uVar23 * 4) !=
                  *(int *)(&DAT_006fe458 + uVar32 * 4)) {
                IVar11 = spv::Builder::makeIntegerType
                                   (local_f8,*(int *)(&DAT_006fe454 + (long)iVar7 * 4),
                                    (uVar33 & 0xfffffff9) == 0);
                OVar26 = (this->builder).module.idToInstruction.
                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)pTVar19]->opCode;
                if (OVar26 == OpTypeCooperativeVectorNV) {
                  IVar12 = spv::Builder::getCooperativeVectorNumComponents(pBVar34,IVar9);
                  IVar11 = spv::Builder::makeCooperativeVectorTypeNV(pBVar34,IVar11,IVar12);
                }
                else if ((int)local_f0 < 1) {
                  if ((OVar26 == OpTypeCooperativeMatrixNV) ||
                     (OVar26 == OpTypeCooperativeMatrixKHR)) {
                    IVar11 = spv::Builder::makeCooperativeMatrixTypeWithSameShape
                                       (pBVar34,IVar11,IVar9);
                  }
                }
                else {
                  IVar11 = spv::Builder::makeVectorType(pBVar34,IVar11,local_f0);
                }
                IVar11 = spv::Builder::createUnaryOp
                                   (pBVar34,((uVar33 & 0xfffffff9) == 0) + OpUConvert,IVar11,
                                    local_104);
              }
              this_02 = (TGlslangToSpvTraverser *)0x7c;
              if ((this->builder).generatingOpCodeForSpecConst == true) {
                uVar6 = (*(code *)(&DAT_006fbfc8 + *(int *)(&DAT_006fbfc8 + local_e8 * 4)))();
                return (bool)uVar6;
              }
              break;
            }
          }
          if (iVar7 == 0xc) {
            switch((ulong)uVar23) {
            case 0:
            case 7:
            case 8:
              iVar7 = 0x20;
              break;
            case 1:
            case 9:
            case 10:
              iVar7 = 0x40;
              if (bVar36 && bVar5) goto LAB_003af5aa;
              IVar11 = spv::Builder::makeIntegerType(local_f8,0x40,false);
              IVar11 = spv::Builder::makeInt64Constant(pBVar34,IVar11,0,false);
              goto LAB_003af591;
            case 2:
            case 5:
            case 6:
              iVar7 = 0x10;
              break;
            case 3:
            case 4:
              iVar7 = 8;
              break;
            default:
switchD_003aefb7_default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/../Include/BaseTypes.h"
                            ,0x276,"uint32_t glslang::GetNumBits(TBasicType)");
            }
            if (bVar36 && bVar5) {
LAB_003af5aa:
              if (2 < uVar23) {
                __assert_fail("isTypeFloat(operandBasicType)",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                              ,0x1fc7,
                              "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                             );
              }
              if (iVar7 == 0x10) {
                IVar11 = spv::Builder::makeFloat16Constant(local_f8,0.0,false);
              }
              else if (iVar7 == 0x20) {
                IVar11 = spv::Builder::makeFloatConstant(local_f8,0.0,false);
              }
              else {
                if (iVar7 != 0x40) {
                  __assert_fail("bits == 16",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                                ,0x1fcd,
                                "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                               );
                }
                IVar11 = spv::Builder::makeDoubleConstant(local_f8,0.0,false);
              }
              IVar11 = makeSmearedConstant(this,IVar11,uVar3);
              this_02 = (TGlslangToSpvTraverser *)0xb7;
            }
            else {
              IVar11 = spv::Builder::makeIntegerType(local_f8,iVar7,false);
              IVar11 = spv::Builder::makeIntConstant(pBVar34,IVar11,0,false);
LAB_003af591:
              IVar11 = makeSmearedConstant(this,IVar11,uVar3);
              this_02 = (TGlslangToSpvTraverser *)0xab;
            }
            IVar9 = spv::Builder::createBinOp(pBVar34,(Op)this_02,IVar9,local_104,IVar11);
            goto LAB_003aed62;
          }
          if (iVar8 != 0xc) {
            if ((int)this_02 != 0) break;
            goto switchD_003aec92_default;
          }
          switch(uVar32) {
          case 0:
          case 7:
          case 8:
            iVar7 = 0x20;
            break;
          case 1:
          case 9:
          case 10:
            iVar7 = 0x40;
            bVar5 = true;
            goto LAB_003af75b;
          case 2:
          case 5:
          case 6:
            iVar7 = 0x10;
            break;
          case 3:
          case 4:
            iVar7 = 8;
            break;
          default:
            goto switchD_003aefb7_default;
          }
          bVar5 = false;
LAB_003af75b:
          if ((uVar14 & 0xfffffff9) == 0 || (uVar24 & 0xfffffff9) == 0) {
            IVar12 = spv::Builder::makeIntegerType(local_f8,iVar7,(uVar14 & 0xfffffff9) == 0);
            if (bVar5) {
              IVar11 = spv::Builder::makeInt64Constant(pBVar34,IVar12,0,false);
              IVar12 = spv::Builder::makeInt64Constant(pBVar34,IVar12,1,false);
            }
            else {
              IVar11 = spv::Builder::makeIntConstant(pBVar34,IVar12,0,false);
              IVar12 = spv::Builder::makeIntConstant(pBVar34,IVar12,1,false);
            }
          }
          else {
            if (2 < uVar31) {
              __assert_fail("isTypeFloat(resultBasicType)",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                            ,0x1fe1,
                            "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                           );
            }
            if (iVar7 == 0x10) {
              IVar11 = spv::Builder::makeFloat16Constant(local_f8,0.0,false);
              IVar12 = spv::Builder::makeFloat16Constant(pBVar34,1.0,false);
            }
            else if (iVar7 == 0x20) {
              IVar11 = spv::Builder::makeFloatConstant(local_f8,0.0,false);
              IVar12 = spv::Builder::makeFloatConstant(pBVar34,1.0,false);
            }
            else {
              if (iVar7 != 0x40) {
                __assert_fail("bits == 16",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                              ,0x1fe9,
                              "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createConversion(glslang::TOperator, OpDecorations &, spv::Id, spv::Id, glslang::TBasicType, glslang::TBasicType)"
                             );
              }
              IVar11 = spv::Builder::makeDoubleConstant(local_f8,0.0,false);
              IVar12 = spv::Builder::makeDoubleConstant(pBVar34,1.0,false);
            }
          }
          uVar3 = local_f0;
          local_e8 = CONCAT44(local_e8._4_4_,IVar12);
          IVar11 = makeSmearedConstant(this,IVar11,local_f0);
          IVar12 = makeSmearedConstant(this,(Id)local_e8,uVar3);
          IVar9 = spv::Builder::createTriOp(pBVar34,OpSelect,IVar9,local_104,IVar12,IVar11);
          goto LAB_003aed2e;
        }
        IVar9 = createUnaryMatrixOperation(this,OpFConvert,&decorations,IVar9,local_104,in_R9D);
        goto LAB_003aed62;
      case EOpConvUint64ToPtr:
        this_02 = (TGlslangToSpvTraverser *)0x78;
        break;
      case EOpConvPtrToUint64:
        this_02 = (TGlslangToSpvTraverser *)0x75;
        break;
      case EOpConvUvec2ToPtr:
      case EOpConvPtrToUvec2:
        this_02 = (TGlslangToSpvTraverser *)0x7c;
        break;
      default:
        goto switchD_003aec92_default;
      }
      pBVar34 = local_f8;
      IVar9 = spv::Builder::createUnaryOp(local_f8,(Op)this_02,IVar9,IVar11);
LAB_003aed2e:
      this_02 = (TGlslangToSpvTraverser *)(ulong)IVar9;
      if ((TVar35 - EpqLow < 2) && (IVar9 != 0)) {
        spv::Builder::addDecoration(pBVar34,IVar9,DecorationRelaxedPrecision,-1);
      }
      spv::Builder::addDecoration(pBVar34,IVar9,decoration,-1);
LAB_003aed62:
      if (IVar9 == 0) {
switchD_003aec92_default:
        TVar16 = (node_local->super_TIntermOperator).op;
        IVar9 = invertedType;
        if (invertedType == 0) {
          iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])();
          pTVar19 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_24,iVar7);
          TVar10 = getExplicitLayout(pTVar19,(TType *)this_02);
          iVar7 = (*(pTVar19->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar19);
          IVar9 = convertGlslangToSpvType
                            (this,(TType *)pTVar19,TVar10,
                             (TQualifier *)CONCAT44(extraout_var_25,iVar7),false,false);
        }
        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        TVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar7) + 0x100))
                           ((long *)CONCAT44(extraout_var_26,iVar7));
        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        IVar9 = createUnaryOperation
                          (this,TVar16,&decorations,IVar9,local_104,TVar15,&lvalueCoherentFlags,
                           (TType *)CONCAT44(extraout_var_27,iVar7));
        pBVar34 = local_f8;
        pTVar27 = node_local;
        if (IVar9 == 0) {
          TVar16 = (node_local->super_TIntermOperator).op;
          if (TVar16 == EOpSpirvInst) {
            this_00 = &node_local->spirvInst;
            iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&this_00->set,"");
            if (iVar7 == 0) {
              plVar21 = (long *)(**(code **)(*plVar20 + 0x18))(plVar20);
              lVar18 = (**(code **)(*plVar21 + 0x108))(plVar21);
              bVar5 = (*(byte *)(lVar18 + 0xf) & 0x10) == 0;
              uVar3 = local_104;
              if (!bVar5) {
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = glslang::GetThreadPoolAllocator();
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_50 = (TIntermConstantUnion *)(**(code **)(*plVar20 + 0x28))(plVar20);
                std::
                vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                ::emplace_back<glslang::TIntermConstantUnion_const*>
                          ((vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                            *)&constants,&local_50);
                TranslateLiterals((TGlslangToSpvTraverser *)
                                  constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (TVector<const_glslang::TIntermConstantUnion_*> *)
                                  constants.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&literals);
                uVar3 = *literals.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                operator_delete(literals.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)literals.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)literals.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar32 = (ulong)bVar5;
              iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x20])();
              OVar26 = (pTVar27->spirvInst).id;
              if (iVar7 != 0) {
                IVar9 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(8);
                pBVar34 = local_f8;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)&(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator)->alignment;
                (constants.
                 super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 .
                 super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 ._M_impl.super__Tp_alloc_type.allocator)->pageSize = (ulong)uVar3 << 0x20 | uVar32;
                constants.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     constants.
                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     .
                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                IVar9 = spv::Builder::createOp
                                  (local_f8,OVar26,IVar9,
                                   (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)
                                   &constants);
                goto LAB_003af33a;
              }
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(8);
              pBVar34 = local_f8;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&(constants.
                              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              .
                              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                              ._M_impl.super__Tp_alloc_type.allocator)->alignment;
              (constants.
               super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               .
               super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               ._M_impl.super__Tp_alloc_type.allocator)->pageSize = (ulong)uVar3 << 0x20 | uVar32;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   constants.
                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   .
                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              spv::Builder::createNoResultOp
                        (local_f8,OVar26,
                         (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&constants);
              if (constants.
                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  .
                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
                operator_delete(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator,
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Tp_alloc_type.allocator);
              }
              IVar9 = 0;
            }
            else {
              IVar9 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&this_00->set,"GLSL.std.450");
              if (iVar7 == 0) {
                IVar11 = this->stdBuiltins;
              }
              else {
                IVar11 = getExtBuiltins(this,(pTVar27->spirvInst).set._M_dataplus._M_p);
              }
              iVar7 = (pTVar27->spirvInst).id;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)operator_new(4);
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)&(constants.
                                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                     .
                                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                     ._M_impl.super__Tp_alloc_type.allocator)->pageSize + 4);
              *(Id *)&(constants.
                       super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                       .
                       super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                       ._M_impl.super__Tp_alloc_type.allocator)->pageSize = local_104;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   constants.
                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   .
                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              IVar9 = spv::Builder::createBuiltinCall
                                (pBVar34,IVar9,IVar11,iVar7,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
LAB_003af33a:
              if (constants.
                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  .
                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
                operator_delete(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator,
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Tp_alloc_type.allocator);
              }
            }
            iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x20])();
            if (iVar7 == 0) goto LAB_003ae630;
            if (IVar9 != 0) goto LAB_003af104;
            TVar16 = (node_local->super_TIntermOperator).op;
          }
          if ((int)TVar16 < 0x157) {
            if ((int)TVar16 < 0xaf) {
              if (TVar16 - EOpPostIncrement < 4) {
                iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x20])(node_local);
                if (iVar7 == 1) {
                  IVar9 = spv::Builder::makeFloatConstant(pBVar34,1.0,false);
                }
                else {
                  iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode
                            ._vptr_TIntermNode[0x20])();
                  if (iVar7 == 2) {
                    IVar9 = spv::Builder::makeDoubleConstant(pBVar34,1.0,false);
                  }
                  else {
                    iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                              super_TIntermNode._vptr_TIntermNode[0x20])();
                    if (iVar7 == 3) {
                      IVar9 = spv::Builder::makeFloat16Constant(pBVar34,1.0,false);
                    }
                    else {
                      iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                super_TIntermNode._vptr_TIntermNode[0x20])();
                      if ((iVar7 == 4) ||
                         (iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                    super_TIntermNode._vptr_TIntermNode[0x20])(), iVar7 == 5)) {
                        IVar9 = spv::Builder::makeInt8Constant(pBVar34,1,false);
                      }
                      else {
                        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                  super_TIntermNode._vptr_TIntermNode[0x20])();
                        if ((iVar7 == 6) ||
                           (iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                      super_TIntermNode._vptr_TIntermNode[0x20])(), iVar7 == 7)) {
                          IVar9 = spv::Builder::makeInt16Constant(pBVar34,1,false);
                        }
                        else {
                          iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                    super_TIntermNode._vptr_TIntermNode[0x20])();
                          if ((iVar7 == 10) ||
                             (iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.
                                        super_TIntermNode._vptr_TIntermNode[0x20])(),
                             pBVar34 = local_f8, iVar7 == 0xb)) {
                            pBVar34 = local_f8;
                            IVar9 = spv::Builder::makeInt64Constant(local_f8,1,false);
                          }
                          else {
                            IVar9 = spv::Builder::makeIntConstant(local_f8,1,false);
                          }
                        }
                      }
                    }
                  }
                }
                TVar16 = (node_local->super_TIntermOperator).op;
                iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                IVar11 = convertGlslangToSpvType
                                   (this,(TType *)CONCAT44(extraout_var_29,iVar7),
                                    forwardReferenceOnly);
                iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                          _vptr_TIntermNode[0x1e])();
                TVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar7) + 0x38))
                                   ((long *)CONCAT44(extraout_var_30,iVar7));
                IVar9 = createBinaryOperation
                                  (this,((TVar16 & ~EOpScope) != EOpPostIncrement) + EOpAdd,
                                   &decorations,IVar11,local_104,IVar9,TVar15,true);
                if (IVar9 == 0) {
                  __assert_fail("result != spv::NoResult",
                                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                                ,0xb10,
                                "virtual bool (anonymous namespace)::TGlslangToSpvTraverser::visitUnary(glslang::TVisit, glslang::TIntermUnary *)"
                               );
                }
                spv::Builder::getAccessChain((AccessChain *)&constants,pBVar34);
                DVar17 = TranslateNonUniformDecoration
                                   (this,(CoherentFlags *)(ulong)(uint)local_58[0]);
                spv::Builder::accessChainStore(pBVar34,IVar9,DVar17,MaskNone,Max,0);
                spv::Builder::AccessChain::~AccessChain((AccessChain *)&constants);
                spv::Builder::clearAccessChain(pBVar34);
                TVar16 = (node_local->super_TIntermOperator).op;
                (this->builder).accessChain.isRValue = true;
                if ((TVar16 & ~EOpSequence) != EOpPreIncrement) {
                  (this->builder).accessChain.base = local_104;
                  goto LAB_003ae630;
                }
                goto LAB_003ae62a;
              }
LAB_003af69c:
              this_01 = this->logger;
              pppTVar1 = &constants.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)pppTVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&constants,"unknown glslang unary","");
              spv::SpvBuildLogger::missingFunctionality(this_01,(string *)&constants);
              if (constants.
                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  .
                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)pppTVar1) {
                operator_delete(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator,
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
              bVar5 = true;
              goto LAB_003ae632;
            }
            if (TVar16 == EOpEmitStreamVertex) {
              OVar26 = OpEmitStreamVertex;
            }
            else {
              if (TVar16 != EOpEndStreamPrimitive) {
                if (TVar16 == EOpCreateTensorLayoutNV) {
                  IVar9 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
                  OVar26 = OpCreateTensorLayoutNV;
                  goto LAB_003af648;
                }
                goto LAB_003af69c;
              }
              OVar26 = OpEndStreamPrimitive;
            }
          }
          else if ((int)TVar16 < 0x280) {
            if (TVar16 == EOpCreateTensorViewNV) {
              IVar9 = visitUnary::anon_class_24_3_db054092::operator()(&resultType);
              OVar26 = OpCreateTensorViewNV;
LAB_003af648:
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
              IVar9 = spv::Builder::createOp
                                (pBVar34,OVar26,IVar9,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&constants);
              if (constants.
                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  .
                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                  ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
                operator_delete(constants.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator,
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)constants.
                                      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      .
                                      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                      ._M_impl.super__Tp_alloc_type.allocator);
              }
              goto LAB_003ae61b;
            }
            if (TVar16 == EOpRayQueryTerminate) {
              OVar26 = OpRayQueryTerminateKHR;
            }
            else {
              if (TVar16 != EOpRayQueryConfirmIntersection) goto LAB_003af69c;
              OVar26 = OpRayQueryConfirmIntersectionKHR;
            }
          }
          else if (TVar16 == EOpHitObjectRecordEmptyNV) {
            OVar26 = OpHitObjectRecordEmptyNV;
          }
          else if (TVar16 == EOpReorderThreadNV) {
            OVar26 = OpReorderThreadWithHitObjectNV;
          }
          else {
            if (TVar16 != EOpAssumeEXT) goto LAB_003af69c;
            constants.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator._0_4_ = 0x15fd;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                        *)&(this->builder).capabilities,(Capability *)&constants);
            spv::Builder::addExtension(pBVar34,"SPV_KHR_expect_assume");
            OVar26 = OpAssumeTrueKHR;
          }
          spv::Builder::createNoResultOp(pBVar34,OVar26,local_104);
          goto LAB_003ae630;
        }
      }
      else {
        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        pBVar34 = local_f8;
        if ((*(byte *)(CONCAT44(extraout_var_19,iVar7) + 10) & 0x40) != 0) {
          iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x31])();
          plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_20,iVar7) + 0x18))
                                      ((long *)CONCAT44(extraout_var_20,iVar7));
          lVar18 = (**(code **)(*plVar20 + 0xf0))(plVar20);
          pBVar34 = local_f8;
          if ((*(byte *)(lVar18 + 10) & 0x40) != 0) {
            iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[3])();
            lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar7) + 0xf0))
                               ((long *)CONCAT44(extraout_var_21,iVar7));
            iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x31])();
            plVar20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_22,iVar7) + 0x18))
                                        ((long *)CONCAT44(extraout_var_22,iVar7));
            lVar22 = (**(code **)(*plVar20 + 0xf0))(plVar20);
            pBVar34 = local_f8;
            if (((*(uint *)(lVar22 + 8) ^ *(uint *)(lVar18 + 8)) & 0x3800000) != 0) {
              constants.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator._0_4_ = 0x1537;
              std::
              _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              ::_M_insert_unique<spv::Capability_const&>
                        ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                          *)&(this->builder).capabilities,(Capability *)&constants);
              spv::Builder::addExtension(pBVar34,"SPV_NV_cooperative_matrix2");
            }
          }
        }
      }
LAB_003af104:
      DVar17 = decorations.precision;
      if (invertedType != 0) {
        iVar7 = (*(node_local->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x31])();
        IVar9 = createInvertedSwizzle
                          (this,DVar17,(TIntermTyped *)CONCAT44(extraout_var_28,iVar7),IVar9);
        spv::Builder::addDecoration(pBVar34,IVar9,decorations.nonUniform,-1);
      }
      spv::Builder::clearAccessChain(pBVar34);
      (this->builder).accessChain.isRValue = true;
      (this->builder).accessChain.base = IVar9;
    }
  }
  else {
LAB_003ae61b:
    spv::Builder::clearAccessChain(pBVar34);
    (this->builder).accessChain.isRValue = true;
LAB_003ae62a:
    (this->builder).accessChain.base = IVar9;
  }
LAB_003ae630:
  bVar5 = false;
LAB_003ae632:
  (this->builder).generatingOpCodeForSpecConst = bVar2;
  return bVar5;
}

Assistant:

bool TGlslangToSpvTraverser::visitUnary(glslang::TVisit /* visit */, glslang::TIntermUnary* node)
{
    builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

    SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
    if (node->getType().getQualifier().isSpecConstant())
        spec_constant_op_mode_setter.turnOnSpecConstantOpMode();

    spv::Id result = spv::NoResult;

    // try texturing first
    result = createImageTextureFunctionCall(node);
    if (result != spv::NoResult) {
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // Non-texturing.

    if (node->getOp() == glslang::EOpArrayLength) {
        // Quite special; won't want to evaluate the operand.

        // Currently, the front-end does not allow .length() on an array until it is sized,
        // except for the last block membeor of an SSBO.
        // TODO: If this changes, link-time sized arrays might show up here, and need their
        // size extracted.

        // Normal .length() would have been constant folded by the front-end.
        // So, this has to be block.lastMember.length().
        // SPV wants "block" and member number as the operands, go get them.

        spv::Id length;
        if (node->getOperand()->getType().isCoopMat()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            assert(builder.isCooperativeMatrixType(typeId));

            if (node->getOperand()->getType().isCoopMatKHR()) {
                length = builder.createCooperativeMatrixLengthKHR(typeId);
            } else {
                spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
                length = builder.createCooperativeMatrixLengthNV(typeId);
            }
        } else if (node->getOperand()->getType().isCoopVecNV()) {
            spv::Id typeId = convertGlslangToSpvType(node->getOperand()->getType());
            length = builder.getCooperativeVectorNumComponents(typeId);
        } else {
            glslang::TIntermTyped* block = node->getOperand()->getAsBinaryNode()->getLeft();
            block->traverse(this);
            unsigned int member = node->getOperand()->getAsBinaryNode()->getRight()->getAsConstantUnion()
                ->getConstArray()[0].getUConst();
            length = builder.createArrayLength(builder.accessChainGetLValue(), member);
        }

        // GLSL semantics say the result of .length() is an int, while SPIR-V says
        // signedness must be 0. So, convert from SPIR-V unsigned back to GLSL's
        // AST expectation of a signed result.
        if (glslangIntermediate->getSource() == glslang::EShSourceGlsl) {
            if (builder.isInSpecConstCodeGenMode()) {
                length = builder.createBinOp(spv::OpIAdd, builder.makeIntType(32), length, builder.makeIntConstant(0));
            } else {
                length = builder.createUnaryOp(spv::OpBitcast, builder.makeIntType(32), length);
            }
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(length);

        return false;
    }

    // Force variable declaration - Debug Mode Only
    if (node->getOp() == glslang::EOpDeclare) {
        builder.clearAccessChain();
        node->getOperand()->traverse(this);
        builder.clearAccessChain();
        return false;
    }

    // Start by evaluating the operand

    // Does it need a swizzle inversion?  If so, evaluation is inverted;
    // operate first on the swizzle base, then apply the swizzle.
    spv::Id invertedType = spv::NoType;
    auto resultType = [&invertedType, &node, this](){ return invertedType != spv::NoType ?
        invertedType : convertGlslangToSpvType(node->getType()); };
    if (node->getOp() == glslang::EOpInterpolateAtCentroid)
        invertedType = getInvertedSwizzleType(*node->getOperand());

    builder.clearAccessChain();
    TIntermNode *operandNode;
    if (invertedType != spv::NoType)
        operandNode = node->getOperand()->getAsBinaryNode()->getLeft();
    else
        operandNode = node->getOperand();

    operandNode->traverse(this);

    spv::Id operand = spv::NoResult;

    spv::Builder::AccessChain::CoherentFlags lvalueCoherentFlags;

    const auto hitObjectOpsWithLvalue = [](glslang::TOperator op) {
        switch(op) {
            case glslang::EOpReorderThreadNV:
            case glslang::EOpHitObjectGetCurrentTimeNV:
            case glslang::EOpHitObjectGetHitKindNV:
            case glslang::EOpHitObjectGetPrimitiveIndexNV:
            case glslang::EOpHitObjectGetGeometryIndexNV:
            case glslang::EOpHitObjectGetInstanceIdNV:
            case glslang::EOpHitObjectGetInstanceCustomIndexNV:
            case glslang::EOpHitObjectGetObjectRayDirectionNV:
            case glslang::EOpHitObjectGetObjectRayOriginNV:
            case glslang::EOpHitObjectGetWorldRayDirectionNV:
            case glslang::EOpHitObjectGetWorldRayOriginNV:
            case glslang::EOpHitObjectGetWorldToObjectNV:
            case glslang::EOpHitObjectGetObjectToWorldNV:
            case glslang::EOpHitObjectGetRayTMaxNV:
            case glslang::EOpHitObjectGetRayTMinNV:
            case glslang::EOpHitObjectIsEmptyNV:
            case glslang::EOpHitObjectIsHitNV:
            case glslang::EOpHitObjectIsMissNV:
            case glslang::EOpHitObjectRecordEmptyNV:
            case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
            case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
            case glslang::EOpHitObjectGetClusterIdNV:
            case glslang::EOpHitObjectGetSpherePositionNV:
            case glslang::EOpHitObjectGetSphereRadiusNV:
            case glslang::EOpHitObjectIsSphereHitNV:
            case glslang::EOpHitObjectIsLSSHitNV:
                return true;
            default:
                return false;
        }
    };

    if (node->getOp() == glslang::EOpAtomicCounterIncrement ||
        node->getOp() == glslang::EOpAtomicCounterDecrement ||
        node->getOp() == glslang::EOpAtomicCounter          ||
        (node->getOp() == glslang::EOpInterpolateAtCentroid &&
          glslangIntermediate->getSource() != glslang::EShSourceHlsl)  ||
        node->getOp() == glslang::EOpRayQueryProceed        ||
        node->getOp() == glslang::EOpRayQueryGetRayTMin     ||
        node->getOp() == glslang::EOpRayQueryGetRayFlags    ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayOrigin ||
        node->getOp() == glslang::EOpRayQueryGetWorldRayDirection ||
        node->getOp() == glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque ||
        node->getOp() == glslang::EOpRayQueryTerminate ||
        node->getOp() == glslang::EOpRayQueryConfirmIntersection ||
        (node->getOp() == glslang::EOpSpirvInst && operandNode->getAsTyped()->getQualifier().isSpirvByReference()) ||
        hitObjectOpsWithLvalue(node->getOp())) {
        operand = builder.accessChainGetLValue(); // Special case l-value operands
        lvalueCoherentFlags = builder.getAccessChain().coherentFlags;
        lvalueCoherentFlags |= TranslateCoherent(operandNode->getAsTyped()->getType());
    } else if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
        // Will be translated to a literal value, make a placeholder here
        operand = spv::NoResult;
    } else {
        operand = accessChainLoad(node->getOperand()->getType());
    }

    OpDecorations decorations = { TranslatePrecisionDecoration(node->getOperationPrecision()),
                                  TranslateNoContractionDecoration(node->getType().getQualifier()),
                                  TranslateNonUniformDecoration(node->getType().getQualifier()) };

    // it could be a conversion
    if (! result) {
        result = createConversion(node->getOp(), decorations, resultType(), operand,
            node->getType().getBasicType(), node->getOperand()->getBasicType());
        if (result) {
            if (node->getType().isCoopMatKHR() && node->getOperand()->getAsTyped()->getType().isCoopMatKHR() &&
                !node->getAsTyped()->getType().sameCoopMatUse(node->getOperand()->getAsTyped()->getType())) {
                // Conversions that change use need CapabilityCooperativeMatrixConversionsNV
                builder.addCapability(spv::CapabilityCooperativeMatrixConversionsNV);
                builder.addExtension(spv::E_SPV_NV_cooperative_matrix2);
            }
        }
    }

    // if not, then possibly an operation
    if (! result)
        result = createUnaryOperation(node->getOp(), decorations, resultType(), operand,
            node->getOperand()->getBasicType(), lvalueCoherentFlags, node->getType());

    // it could be attached to a SPIR-V intruction
    if (!result) {
        if (node->getOp() == glslang::EOpSpirvInst) {
            const auto& spirvInst = node->getSpirvInstruction();
            if (spirvInst.set == "") {
                spv::IdImmediate idImmOp = {true, operand};
                if (operandNode->getAsTyped()->getQualifier().isSpirvLiteral()) {
                    // Translate the constant to a literal value
                    std::vector<unsigned> literals;
                    glslang::TVector<const glslang::TIntermConstantUnion*> constants;
                    constants.push_back(operandNode->getAsConstantUnion());
                    TranslateLiterals(constants, literals);
                    idImmOp = {false, literals[0]};
                }

                if (node->getBasicType() == glslang::EbtVoid)
                    builder.createNoResultOp(static_cast<spv::Op>(spirvInst.id), {idImmOp});
                else
                    result = builder.createOp(static_cast<spv::Op>(spirvInst.id), resultType(), {idImmOp});
            } else {
                result = builder.createBuiltinCall(
                    resultType(), spirvInst.set == "GLSL.std.450" ? stdBuiltins : getExtBuiltins(spirvInst.set.c_str()),
                    spirvInst.id, {operand});
            }

            if (node->getBasicType() == glslang::EbtVoid)
                return false; // done with this node
        }
    }

    if (result) {
        if (invertedType) {
            result = createInvertedSwizzle(decorations.precision, *node->getOperand(), result);
            decorations.addNonUniform(builder, result);
        }

        builder.clearAccessChain();
        builder.setAccessChainRValue(result);

        return false; // done with this node
    }

    // it must be a special case, check...
    switch (node->getOp()) {
    case glslang::EOpPostIncrement:
    case glslang::EOpPostDecrement:
    case glslang::EOpPreIncrement:
    case glslang::EOpPreDecrement:
        {
            // we need the integer value "1" or the floating point "1.0" to add/subtract
            spv::Id one = 0;
            if (node->getBasicType() == glslang::EbtFloat)
                one = builder.makeFloatConstant(1.0F);
            else if (node->getBasicType() == glslang::EbtDouble)
                one = builder.makeDoubleConstant(1.0);
            else if (node->getBasicType() == glslang::EbtFloat16)
                one = builder.makeFloat16Constant(1.0F);
            else if (node->getBasicType() == glslang::EbtInt8  || node->getBasicType() == glslang::EbtUint8)
                one = builder.makeInt8Constant(1);
            else if (node->getBasicType() == glslang::EbtInt16 || node->getBasicType() == glslang::EbtUint16)
                one = builder.makeInt16Constant(1);
            else if (node->getBasicType() == glslang::EbtInt64 || node->getBasicType() == glslang::EbtUint64)
                one = builder.makeInt64Constant(1);
            else
                one = builder.makeIntConstant(1);
            glslang::TOperator op;
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPostIncrement)
                op = glslang::EOpAdd;
            else
                op = glslang::EOpSub;

            spv::Id result = createBinaryOperation(op, decorations,
                                                   convertGlslangToSpvType(node->getType()), operand, one,
                                                   node->getType().getBasicType());
            assert(result != spv::NoResult);

            // The result of operation is always stored, but conditionally the
            // consumed result.  The consumed result is always an r-value.
            builder.accessChainStore(result,
                                     TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags));
            builder.clearAccessChain();
            if (node->getOp() == glslang::EOpPreIncrement ||
                node->getOp() == glslang::EOpPreDecrement)
                builder.setAccessChainRValue(result);
            else
                builder.setAccessChainRValue(operand);
        }

        return false;

    case glslang::EOpAssumeEXT:
        builder.addCapability(spv::CapabilityExpectAssumeKHR);
        builder.addExtension(spv::E_SPV_KHR_expect_assume);
        builder.createNoResultOp(spv::OpAssumeTrueKHR, operand);
        return false;
    case glslang::EOpEmitStreamVertex:
        builder.createNoResultOp(spv::OpEmitStreamVertex, operand);
        return false;
    case glslang::EOpEndStreamPrimitive:
        builder.createNoResultOp(spv::OpEndStreamPrimitive, operand);
        return false;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR, operand);
        return false;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR, operand);
        return false;
    case glslang::EOpReorderThreadNV:
        builder.createNoResultOp(spv::OpReorderThreadWithHitObjectNV, operand);
        return false;
    case glslang::EOpHitObjectRecordEmptyNV:
        builder.createNoResultOp(spv::OpHitObjectRecordEmptyNV, operand);
        return false;

    case glslang::EOpCreateTensorLayoutNV:
        result = builder.createOp(spv::OpCreateTensorLayoutNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    case glslang::EOpCreateTensorViewNV:
        result = builder.createOp(spv::OpCreateTensorViewNV, resultType(), std::vector<spv::Id>{});
        builder.clearAccessChain();
        builder.setAccessChainRValue(result);
        return false;

    default:
        logger->missingFunctionality("unknown glslang unary");
        return true;  // pick up operand as placeholder result
    }
}